

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test::
TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test
           *this)

{
  TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test *this_local;
  
  memset(this,0,0x28);
  TEST_GROUP_CppUTestGroupJUnitOutputTest::TEST_GROUP_CppUTestGroupJUnitOutputTest
            (&this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest);
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_JUnitOutputTest_withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock_Test_003d1060
  ;
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestFileShouldContainsATestCaseBlock)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("</testcase>\n", outputFile->line(6));
}